

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TimeInMillis testing::internal::GetTimeInMillis(void)

{
  rep rVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::from_time_t(0);
  local_18.__r = (rep)std::chrono::operator-(&local_20,&local_28);
  local_10.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_18);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
  return rVar1;
}

Assistant:

TimeInMillis GetTimeInMillis() {
  return std::chrono::duration_cast<std::chrono::milliseconds>(
             std::chrono::system_clock::now() -
             std::chrono::system_clock::from_time_t(0))
      .count();
}